

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlPass::DebugEngineCode(GdlPass *this,GrcManager *pcman,uint32_t fxdRuleVersion,ostream *strmOut)

{
  int iVar1;
  ostream *poVar2;
  size_type_conflict sVar3;
  reference ppGVar4;
  ostream *in_RCX;
  undefined4 in_EDX;
  GrpLineAndFile *in_RSI;
  GdlPass *in_RDI;
  GdlRule *unaff_retaddr;
  size_t iprul;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbPassConstraints;
  int nPassNum;
  ostream *in_stack_00000130;
  uint32_t in_stack_0000013c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000140;
  ostream *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa8;
  ulong uVar5;
  ulong __n;
  uint32_t in_stack_ffffffffffffffb4;
  GrcManager *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  GrcManager *in_stack_ffffffffffffffc8;
  GdlRule *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  GdlPass *pcman_00;
  
  pcman_00 = in_RDI;
  iVar1 = PassDebuggerNumber(in_RDI);
  poVar2 = std::operator<<(in_RCX,"\nPASS: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x116164);
  GenerateEngineCode((GdlPass *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &stack0xffffffffffffffc0);
  if (sVar3 == 0) {
    std::operator<<(in_RCX,"\nPASS CONSTRAINTS: none\n");
  }
  else {
    std::operator<<(in_RCX,"\nPASS CONSTRAINTS:\n");
    GdlRule::DebugEngineCode(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  }
  sVar3 = std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::size(&in_RDI->m_vprule);
  if (sVar3 == 0) {
    std::operator<<(in_RCX,"\nNO RULES\n");
  }
  uVar5 = 0;
  while( true ) {
    __n = uVar5;
    sVar3 = std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::size(&in_RDI->m_vprule);
    if (sVar3 <= uVar5) break;
    poVar2 = std::operator<<(in_RCX,"\nRULE ");
    in_stack_ffffffffffffff80 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(in_stack_ffffffffffffff80,".");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,__n);
    std::operator<<(poVar2,", ");
    ppGVar4 = std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::operator[](&in_RDI->m_vprule,__n);
    GdlObject::LineAndFile(&(*ppGVar4)->super_GdlObject);
    GrpLineAndFile::WriteToStream
              (in_RSI,(ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               SUB81((ulong)in_RCX >> 0x38,0));
    std::operator<<(in_RCX,":  ");
    std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::operator[](&in_RDI->m_vprule,__n);
    GdlRule::RulePrettyPrint
              (unaff_retaddr,(GrcManager *)pcman_00,(ostream *)in_RSI,SUB41((uint)in_EDX >> 0x18,0))
    ;
    std::operator<<(in_RCX,"\n");
    std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::operator[](&in_RDI->m_vprule,__n);
    GdlRule::DebugEngineCode
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
               (ostream *)in_stack_ffffffffffffffb8);
    uVar5 = __n + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void GdlPass::DebugEngineCode(GrcManager * pcman, uint32_t fxdRuleVersion, std::ostream & strmOut)
{
	int nPassNum = PassDebuggerNumber();
	strmOut << "\nPASS: " << nPassNum << "\n";

	std::vector<gr::byte> vbPassConstraints;
	GenerateEngineCode(pcman, fxdRuleVersion, vbPassConstraints);
	if (vbPassConstraints.size() == 0)
	{
		strmOut << "\nPASS CONSTRAINTS: none\n";
	}
	else
	{
		strmOut << "\nPASS CONSTRAINTS:\n";
		GdlRule::DebugEngineCode(vbPassConstraints, fxdRuleVersion, strmOut);
	}

	if (m_vprule.size() == 0)
		strmOut << "\nNO RULES\n";

	for (size_t iprul = 0; iprul < m_vprule.size(); iprul++)
	{
		strmOut << "\nRULE " << nPassNum << "." << iprul << ", ";
		m_vprule[iprul]->LineAndFile().WriteToStream(strmOut, true);
		strmOut << ":  ";

		m_vprule[iprul]->RulePrettyPrint(pcman, strmOut, false);
		strmOut << "\n";
		m_vprule[iprul]->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
	}
}